

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O0

int testMiniBatchSizeOutOfAllowedRange(void)

{
  set<long,_std::less<long>,_std::allocator<long>_> *this;
  NeuralNetwork *nn_00;
  ostream *poVar1;
  undefined1 local_b0 [8];
  Result res;
  NeuralNetwork *nn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&nn);
  nn_00 = buildBasicUpdatableNeuralNetworkModel((Model *)&nn);
  addLearningRate<CoreML::Specification::NeuralNetwork>
            (nn_00,kSgdOptimizer,0.699999988079071,0.0,1.0);
  res.m_message.field_2._8_8_ = 0;
  this = (set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8);
  std::set<long,_std::less<long>,_std::allocator<long>_>::set(this);
  addMiniBatchSize<CoreML::Specification::NeuralNetwork>(nn_00,kSgdOptimizer,5,10,100,this);
  std::set<long,_std::less<long>,_std::allocator<long>_>::~set
            ((set<long,_std::less<long>,_std::allocator<long>_> *)((long)&res.m_message.field_2 + 8)
            );
  CoreML::Model::validate((Result *)local_b0,(Model *)&nn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_b0);
  if (m._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/ParameterTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x11d);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)&nn);
  return m._oneof_case_[0];
}

Assistant:

int testMiniBatchSizeOutOfAllowedRange() {
    
    Specification::Model m;
    
    // basic neural network model without any updatable model parameters.
    auto nn = buildBasicUpdatableNeuralNetworkModel(m);
    
    addLearningRate(nn, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(nn, Specification::Optimizer::kSgdOptimizer, 5, 10, 100);
    
    // expect validation to fail due to conflict in updatable model parameter names.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);
    return 0;
}